

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O2

TightBoundingBox * __thiscall
bezier::Bezier<3UL>::tbb(TightBoundingBox *__return_storage_ptr__,Bezier<3UL> *this)

{
  double dVar1;
  double dVar2;
  Bezier<3UL> bezier;
  _Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_> local_90;
  Vec2 local_78;
  Vec2 local_68;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_68.x = (this->mControlPoints)._M_elems[0].x;
  local_68.y = (this->mControlPoints)._M_elems[0].y;
  local_58 = (this->mControlPoints)._M_elems[1].x;
  dStack_50 = (this->mControlPoints)._M_elems[1].y;
  local_48 = (this->mControlPoints)._M_elems[2].x;
  dStack_40 = (this->mControlPoints)._M_elems[2].y;
  dVar1 = (this->mControlPoints)._M_elems[3].x;
  dVar2 = (this->mControlPoints)._M_elems[3].y;
  local_38._0_4_ = SUB84(dVar1,0);
  local_38._4_4_ = (uint)((ulong)dVar1 >> 0x20);
  uStack_30._0_4_ = SUB84(dVar2,0);
  uStack_30._4_4_ = (uint)((ulong)dVar2 >> 0x20);
  local_78.x._4_4_ = local_38._4_4_ ^ 0x80000000;
  local_78.y._4_4_ = uStack_30._4_4_ ^ 0x80000000;
  local_78.x._0_4_ = (undefined4)local_38;
  local_78.y._0_4_ = (undefined4)uStack_30;
  local_38 = dVar1;
  uStack_30 = dVar2;
  translate((Bezier<3UL> *)&local_68,&local_78);
  dVar1 = Vec2::angle(&local_68);
  rotate((Bezier<3UL> *)&local_68,-dVar1,(Vec2)ZEXT816(0));
  extremePoints((ExtremePoints *)&local_90,(Bezier<3UL> *)&local_68);
  TightBoundingBox::TightBoundingBox
            (__return_storage_ptr__,(ExtremePoints *)&local_90,&local_78,-dVar1);
  std::_Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>::~_Vector_base(&local_90);
  return __return_storage_ptr__;
}

Assistant:

TightBoundingBox tbb() const
        {
            Bezier<N> bezier = *this;

            // Translate last control point (highest order) to origo.
            Vec2 translation(-bezier[N]);
            bezier.translate(translation);

            // Rotate bezier to align the first control point (lowest order) with the x-axis
            double angle = -bezier[0].angle();
            bezier.rotate(angle);

            return TightBoundingBox(bezier.extremePoints(), translation, angle);
        }